

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O2

int ZSTD_isRLE(BYTE *src,size_t length)

{
  ulong *puVar1;
  long *plVar2;
  ulong uVar3;
  BYTE *ip;
  BYTE *pBVar4;
  ulong *puVar5;
  BYTE *pStart;
  long lVar6;
  ulong uVar7;
  int *piVar8;
  ulong uVar9;
  
  if (length != 1) {
    uVar3 = (ulong)((uint)length & 0x1f);
    if ((length & 0x1f) != 0) {
      puVar5 = (ulong *)(src + 1);
      piVar8 = (int *)src;
      if (uVar3 < 9) {
LAB_001ad9eb:
        puVar1 = (ulong *)(src + uVar3);
        if ((puVar5 < (ulong *)((long)puVar1 - 3U)) && (*piVar8 == (int)*puVar5)) {
          puVar5 = (ulong *)((long)puVar5 + 4);
          piVar8 = piVar8 + 1;
        }
        if ((puVar5 < (ulong *)((long)puVar1 - 1U)) && ((short)*piVar8 == (short)*puVar5)) {
          puVar5 = (ulong *)((long)puVar5 + 2);
          piVar8 = (int *)((long)piVar8 + 2);
        }
        if (puVar5 < puVar1) {
          puVar5 = (ulong *)((long)puVar5 + (ulong)((char)*piVar8 == (char)*puVar5));
        }
        uVar9 = (long)puVar5 - (long)(src + 1);
      }
      else if (*(ulong *)src == *(ulong *)(src + 1)) {
        puVar5 = (ulong *)(src + 9);
        lVar6 = 0;
        do {
          if (src + (uVar3 - 7) <= puVar5) {
            piVar8 = (int *)((long)puVar5 + -1);
            goto LAB_001ad9eb;
          }
          puVar1 = (ulong *)((long)puVar5 + -1);
          uVar9 = *puVar5;
          puVar5 = puVar5 + 1;
          lVar6 = lVar6 + 8;
        } while (*puVar1 == uVar9);
        uVar9 = uVar9 ^ *puVar1;
        uVar7 = 0;
        if (uVar9 != 0) {
          for (; (uVar9 >> uVar7 & 1) == 0; uVar7 = uVar7 + 1) {
          }
        }
        uVar9 = (uVar7 >> 3 & 0x1fffffff) + lVar6;
      }
      else {
        uVar7 = *(ulong *)(src + 1) ^ *(ulong *)src;
        uVar9 = 0;
        if (uVar7 != 0) {
          for (; (uVar7 >> uVar9 & 1) == 0; uVar9 = uVar9 + 1) {
          }
        }
        uVar9 = uVar9 >> 3 & 0x1fffffff;
      }
      if (uVar9 != uVar3 - 1) {
        return 0;
      }
    }
    pBVar4 = src + uVar3;
    for (; uVar3 != length; uVar3 = uVar3 + 0x20) {
      uVar9 = 0;
      while (uVar9 < 0x20) {
        plVar2 = (long *)(pBVar4 + uVar9);
        uVar9 = uVar9 + 8;
        if (*plVar2 != (ulong)*src * 0x101010101010101) {
          return 0;
        }
      }
      pBVar4 = pBVar4 + 0x20;
    }
  }
  return 1;
}

Assistant:

static int ZSTD_isRLE(const BYTE* src, size_t length) {
    const BYTE* ip = src;
    const BYTE value = ip[0];
    const size_t valueST = (size_t)((U64)value * 0x0101010101010101ULL);
    const size_t unrollSize = sizeof(size_t) * 4;
    const size_t unrollMask = unrollSize - 1;
    const size_t prefixLength = length & unrollMask;
    size_t i;
    if (length == 1) return 1;
    /* Check if prefix is RLE first before using unrolled loop */
    if (prefixLength && ZSTD_count(ip+1, ip, ip+prefixLength) != prefixLength-1) {
        return 0;
    }
    for (i = prefixLength; i != length; i += unrollSize) {
        size_t u;
        for (u = 0; u < unrollSize; u += sizeof(size_t)) {
            if (MEM_readST(ip + i + u) != valueST) {
                return 0;
    }   }   }
    return 1;
}